

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

RPCHelpMan * getrawaddrman(void)

{
  size_type *psVar1;
  ulong *puVar2;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  RPCHelpMan *in_RDI;
  undefined8 uVar8;
  long lVar9;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_fffffffffffff288;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffff28c;
  undefined8 in_stack_fffffffffffff298;
  undefined8 in_stack_fffffffffffff2a0;
  undefined8 in_stack_fffffffffffff2a8;
  code *pcVar11;
  undefined8 in_stack_fffffffffffff2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff2b8;
  pointer in_stack_fffffffffffff2c8;
  pointer pRVar12;
  pointer in_stack_fffffffffffff2d0;
  pointer pRVar13;
  pointer in_stack_fffffffffffff2d8;
  pointer pRVar14;
  undefined8 in_stack_fffffffffffff2e0;
  pointer pRVar15;
  pointer pRVar16;
  pointer pRVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff300;
  pointer in_stack_fffffffffffff310;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ce8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_cc8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ca8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c70;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c58;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c38;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c18;
  vector<RPCResult,_std::allocator<RPCResult>_> local_bf8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_be0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_bc8;
  RPCResults local_bb0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_b98;
  string local_b78;
  string local_b58;
  string local_b38;
  string local_b18;
  string local_af8;
  string local_ad8;
  ulong *local_ab8;
  undefined8 local_ab0;
  ulong local_aa8;
  undefined8 uStack_aa0;
  ulong *local_a98;
  size_type local_a90;
  ulong local_a88;
  undefined8 uStack_a80;
  long *local_a78 [2];
  long local_a68 [2];
  long *local_a58 [2];
  long local_a48 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  size_type *local_9f8;
  size_type local_9f0;
  size_type local_9e8;
  undefined8 uStack_9e0;
  long *local_9d8 [2];
  long local_9c8 [2];
  long *local_9b8 [2];
  long local_9a8 [2];
  long *local_998 [2];
  long local_988 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  size_type *local_958;
  size_type local_950;
  size_type local_948;
  undefined8 uStack_940;
  long *local_938 [2];
  long local_928 [2];
  long *local_918 [2];
  long local_908 [2];
  long *local_8f8 [2];
  long local_8e8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  size_type *local_898;
  size_type local_890;
  size_type local_888;
  undefined8 uStack_880;
  long *local_878 [2];
  long local_868 [2];
  long *local_858 [2];
  long local_848 [2];
  long *local_838 [2];
  long local_828 [2];
  long *local_818 [2];
  long local_808 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_7f8;
  long *local_7d8 [2];
  long local_7c8 [2];
  pointer local_7b8 [2];
  undefined1 local_7a8 [152];
  RPCResult local_710;
  RPCResult local_688;
  RPCResult local_600;
  RPCResult local_578;
  RPCResult local_4f0;
  RPCResult local_468;
  RPCResult local_3e0;
  RPCResult local_358;
  long *local_2d0 [2];
  long local_2c0 [2];
  long *local_2b0 [2];
  long local_2a0 [2];
  RPCResult local_290;
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  RPCResult local_1c8;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getrawaddrman","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "EXPERIMENTAL warning: this call may be changed in future releases.\n\nReturns information on all address manager entries for the new and tried tables.\n"
             ,"");
  local_120[0] = local_110;
  local_b98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"table","");
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_208,
             "buckets with addresses in the address manager table ( new, tried )","");
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"bucket/position","");
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,"the location in the address manager table (<bucket>/<position>)",
             "");
  local_7b8[0] = (pointer)local_7a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7b8,"address","");
  local_7d8[0] = local_7c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7d8,"The address of the node","");
  local_c18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff28c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff288;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff298;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff2a0;
  description._M_string_length = in_stack_fffffffffffff2b0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2a8;
  description.field_2 = in_stack_fffffffffffff2b8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff2d0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff2c8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff2d8;
  RPCResult::RPCResult
            ((RPCResult *)(local_7a8 + 0x10),STR,m_key_name,description,inner,SUB81(local_7b8,0));
  local_7f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_7f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"mapped_as","");
  local_818[0] = local_808;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_818,"The ASN mapped to the IP of this peer per our current ASMap","");
  local_c38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = 0;
  auVar3._4_8_ = in_RDI;
  auVar3._0_4_ = in_stack_fffffffffffff28c;
  auVar3._12_8_ = in_stack_fffffffffffff298;
  auVar3._20_8_ = in_stack_fffffffffffff2a0;
  auVar3._28_4_ = 0;
  description_00._M_string_length = in_stack_fffffffffffff2b0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2a8;
  description_00.field_2 = in_stack_fffffffffffff2b8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff2d0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff2c8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff2d8;
  RPCResult::RPCResult
            (&local_710,NUM,(string)(auVar3 << 0x20),SUB81(&local_7f8,0),description_00,inner_00,
             true);
  local_838[0] = local_828;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"port","");
  local_858[0] = local_848;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_858,"The port number of the node","");
  local_c58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff28c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff298;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff2a0;
  description_01._M_string_length = in_stack_fffffffffffff2b0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2a8;
  description_01.field_2 = in_stack_fffffffffffff2b8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff2d0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff2c8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff2d8;
  RPCResult::RPCResult(&local_688,NUM,m_key_name_00,description_01,inner_01,SUB81(local_838,0));
  local_878[0] = local_868;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_878,"network","");
  GetNetworkNames_abi_cxx11_(&local_c70,false);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_8d8,(util *)&local_c70,", ");
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_8d8,0,0,"The network (",0xd);
  local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if (paVar7 == paVar6) {
    local_8b8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_8b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_8b8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_8b8._M_dataplus._M_p = (pointer)paVar7;
  }
  local_8b8._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_8b8,") of the address");
  local_898 = &local_888;
  psVar1 = (size_type *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar7) {
    local_888 = paVar7->_M_allocated_capacity;
    uStack_880 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_888 = paVar7->_M_allocated_capacity;
    local_898 = psVar1;
  }
  local_890 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  local_c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff28c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff298;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff2a0;
  description_02._M_string_length = in_stack_fffffffffffff2b0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2a8;
  description_02.field_2 = in_stack_fffffffffffff2b8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff2d0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff2c8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff2d8;
  RPCResult::RPCResult(&local_600,STR,m_key_name_01,description_02,inner_02,SUB81(local_878,0));
  local_8f8[0] = local_8e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f8,"services","");
  local_918[0] = local_908;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_918,"The services offered by the node","");
  local_ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff28c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff298;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff2a0;
  description_03._M_string_length = in_stack_fffffffffffff2b0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2a8;
  description_03.field_2 = in_stack_fffffffffffff2b8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff2d0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff2c8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff2d8;
  RPCResult::RPCResult(&local_578,NUM,m_key_name_02,description_03,inner_03,SUB81(local_8f8,0));
  local_938[0] = local_928;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_938,"time","");
  std::operator+(&local_978,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_978," when the node was last seen");
  local_958 = &local_948;
  psVar1 = (size_type *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar7) {
    local_948 = paVar7->_M_allocated_capacity;
    uStack_940 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_948 = paVar7->_M_allocated_capacity;
    local_958 = psVar1;
  }
  local_950 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff28c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff298;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff2a0;
  description_04._M_string_length = in_stack_fffffffffffff2b0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2a8;
  description_04.field_2 = in_stack_fffffffffffff2b8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff2d0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff2c8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff2d8;
  RPCResult::RPCResult(&local_4f0,NUM_TIME,m_key_name_03,description_04,inner_04,SUB81(local_938,0))
  ;
  local_998[0] = local_988;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_998,"source","");
  local_9b8[0] = local_9a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9b8,"The address that relayed the address to us","");
  local_ce8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ce8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ce8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff28c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff298;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff2a0;
  description_05._M_string_length = in_stack_fffffffffffff2b0;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2a8;
  description_05.field_2 = in_stack_fffffffffffff2b8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff2d0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff2c8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff2d8;
  RPCResult::RPCResult(&local_468,STR,m_key_name_04,description_05,inner_05,SUB81(local_998,0));
  local_9d8[0] = local_9c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"source_network","");
  GetNetworkNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xfffffffffffff300,false);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_a38,(util *)&stack0xfffffffffffff300,", ");
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_a38,0,0,"The network (",0xd);
  local_a18._M_dataplus._M_p = (pointer)&local_a18.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if (paVar7 == paVar6) {
    local_a18.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_a18.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_a18.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_a18._M_dataplus._M_p = (pointer)paVar7;
  }
  local_a18._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_a18,") of the source address");
  local_9f8 = &local_9e8;
  psVar1 = (size_type *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar7) {
    local_9e8 = paVar7->_M_allocated_capacity;
    uStack_9e0 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_9e8 = paVar7->_M_allocated_capacity;
    local_9f8 = psVar1;
  }
  local_9f0 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  pRVar17 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff28c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_05._M_string_length = (size_type)in_RDI;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff298;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff2a0;
  description_06._M_string_length = in_stack_fffffffffffff2b0;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2a8;
  description_06.field_2 = in_stack_fffffffffffff2b8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff2d0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff2c8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff2d8;
  RPCResult::RPCResult(&local_3e0,STR,m_key_name_05,description_06,inner_06,SUB81(local_9d8,0));
  local_a58[0] = local_a48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a58,"source_mapped_as","");
  local_a78[0] = local_a68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a78,
             "The ASN mapped to the IP of this peer\'s source per our current ASMap","");
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  uVar10 = 0;
  auVar4._4_8_ = in_RDI;
  auVar4._0_4_ = in_stack_fffffffffffff28c;
  auVar4._12_8_ = in_stack_fffffffffffff298;
  auVar4._20_8_ = in_stack_fffffffffffff2a0;
  auVar4._28_4_ = 0;
  description_07._M_string_length = in_stack_fffffffffffff2b0;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2a8;
  description_07.field_2._M_local_buf = in_stack_fffffffffffff2b8._M_local_buf;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (&local_358,NUM,(string)(auVar4 << 0x20),SUB81(local_a58,0),description_07,inner_07,true
            );
  __l._M_len = 9;
  __l._M_array = (iterator)(local_7a8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_bf8,__l,(allocator_type *)&stack0xfffffffffffff2c7);
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff28c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_06._M_string_length = (size_type)in_RDI;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_fffffffffffff298;
  m_key_name_06.field_2._8_8_ = in_stack_fffffffffffff2a0;
  description_08._M_string_length = in_stack_fffffffffffff2b0;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2a8;
  description_08.field_2._M_local_buf = in_stack_fffffffffffff2b8._M_local_buf;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar13;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar12;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar14;
  RPCResult::RPCResult(&local_290,OBJ,m_key_name_06,description_08,inner_08,SUB81(local_2b0,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_290;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_be0,__l_00,(allocator_type *)&stack0xfffffffffffff2c6);
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff28c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_07._M_string_length = (size_type)in_RDI;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_fffffffffffff298;
  m_key_name_07.field_2._8_8_ = in_stack_fffffffffffff2a0;
  description_09._M_string_length = in_stack_fffffffffffff2b0;
  description_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2a8;
  description_09.field_2._M_local_buf = in_stack_fffffffffffff2b8._M_local_buf;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar13;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar12;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar14;
  RPCResult::RPCResult(&local_1c8,OBJ_DYN,m_key_name_07,description_09,inner_09,SUB81(local_1e8,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_1c8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_bc8,__l_01,(allocator_type *)&stack0xfffffffffffff2c5);
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff28c;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_08._M_string_length = (size_type)in_RDI;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_fffffffffffff298;
  m_key_name_08.field_2._8_8_ = in_stack_fffffffffffff2a0;
  description_10._M_string_length = in_stack_fffffffffffff2b0;
  description_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2a8;
  description_10.field_2 = in_stack_fffffffffffff2b8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar13;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar12;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar14;
  RPCResult::RPCResult(&local_100,OBJ_DYN,m_key_name_08,description_10,inner_10,SUB81(local_120,0));
  result._4_4_ = in_stack_fffffffffffff28c;
  result.m_type = uVar10;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_fffffffffffff298;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff2a0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff2a8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff2b0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff2b8;
  result._64_8_ = pRVar12;
  result.m_description._M_dataplus._M_p = (pointer)pRVar13;
  result.m_description._M_string_length = (size_type)pRVar14;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff2e0;
  result.m_description.field_2._8_8_ = pRVar15;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar16;
  result.m_cond._M_string_length = (size_type)pRVar17;
  result.m_cond.field_2 = in_stack_fffffffffffff300;
  RPCResults::RPCResults(&local_bb0,result);
  local_af8._M_dataplus._M_p = (pointer)&local_af8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_af8,"getrawaddrman","");
  local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b18,"");
  HelpExampleCli(&local_ad8,&local_af8,&local_b18);
  local_b58._M_dataplus._M_p = (pointer)&local_b58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b58,"getrawaddrman","");
  local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b78,"");
  HelpExampleRpc(&local_b38,&local_b58,&local_b78);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
    uVar8 = local_ad8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_b38._M_string_length + local_ad8._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
      uVar8 = local_b38.field_2._M_allocated_capacity;
    }
    if (local_b38._M_string_length + local_ad8._M_string_length <= (ulong)uVar8) {
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_b38,0,0,local_ad8._M_dataplus._M_p,local_ad8._M_string_length);
      goto LAB_00a3df87;
    }
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_ad8,local_b38._M_dataplus._M_p,local_b38._M_string_length);
LAB_00a3df87:
  local_ab8 = &local_aa8;
  puVar2 = (ulong *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar7) {
    local_aa8 = paVar7->_M_allocated_capacity;
    uStack_aa0 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_aa8 = paVar7->_M_allocated_capacity;
    local_ab8 = puVar2;
  }
  local_a90 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  if (local_ab8 == &local_aa8) {
    uStack_a80 = uStack_aa0;
    local_a98 = &local_a88;
  }
  else {
    local_a98 = local_ab8;
  }
  local_a88 = local_aa8;
  local_ab0 = 0;
  local_aa8 = local_aa8 & 0xffffffffffffff00;
  pcVar11 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/net.cpp:1169:9)>
            ::_M_manager;
  description_11._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/net.cpp:1169:9)>
       ::_M_invoke;
  description_11._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/net.cpp:1169:9)>
                ::_M_manager;
  description_11.field_2 = in_stack_fffffffffffff2b8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar13;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar12;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar14;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar15;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff2e0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar16;
  examples.m_examples._8_16_ = in_stack_fffffffffffff300;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar17;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff310;
  local_ab8 = &local_aa8;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff298)),description_11,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar11 != (code *)0x0) {
    (*pcVar11)(&stack0xfffffffffffff298,&stack0xfffffffffffff298,3);
  }
  if (local_a98 != &local_a88) {
    operator_delete(local_a98,local_a88 + 1);
  }
  if (local_ab8 != &local_aa8) {
    operator_delete(local_ab8,local_aa8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
    operator_delete(local_b38._M_dataplus._M_p,local_b38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
    operator_delete(local_b78._M_dataplus._M_p,local_b78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b58._M_dataplus._M_p != &local_b58.field_2) {
    operator_delete(local_b58._M_dataplus._M_p,local_b58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
    operator_delete(local_ad8._M_dataplus._M_p,local_ad8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
    operator_delete(local_b18._M_dataplus._M_p,local_b18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
    operator_delete(local_af8._M_dataplus._M_p,local_af8.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_bb0.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_bc8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_cond._M_dataplus._M_p != &local_1c8.m_cond.field_2) {
    operator_delete(local_1c8.m_cond._M_dataplus._M_p,
                    local_1c8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_description._M_dataplus._M_p != &local_1c8.m_description.field_2) {
    operator_delete(local_1c8.m_description._M_dataplus._M_p,
                    local_1c8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_key_name._M_dataplus._M_p != &local_1c8.m_key_name.field_2) {
    operator_delete(local_1c8.m_key_name._M_dataplus._M_p,
                    local_1c8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_be0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_cond._M_dataplus._M_p != &local_290.m_cond.field_2) {
    operator_delete(local_290.m_cond._M_dataplus._M_p,
                    local_290.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_description._M_dataplus._M_p != &local_290.m_description.field_2) {
    operator_delete(local_290.m_description._M_dataplus._M_p,
                    local_290.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_290.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_key_name._M_dataplus._M_p != &local_290.m_key_name.field_2) {
    operator_delete(local_290.m_key_name._M_dataplus._M_p,
                    local_290.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_bf8);
  lVar9 = 0x4c8;
  do {
    if ((long *)(local_7a8 + lVar9) != *(long **)((long)local_7b8 + lVar9)) {
      operator_delete(*(long **)((long)local_7b8 + lVar9),*(long *)(local_7a8 + lVar9) + 1);
    }
    if ((long *)((long)local_7c8 + lVar9) != *(long **)((long)local_7d8 + lVar9)) {
      operator_delete(*(long **)((long)local_7d8 + lVar9),*(long *)((long)local_7c8 + lVar9) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_7f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar9));
    if ((long *)((long)local_808 + lVar9) != *(long **)((long)local_818 + lVar9)) {
      operator_delete(*(long **)((long)local_818 + lVar9),*(long *)((long)local_808 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x88;
  } while (lVar9 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff2c8);
  if (local_a78[0] != local_a68) {
    operator_delete(local_a78[0],local_a68[0] + 1);
  }
  if (local_a58[0] != local_a48) {
    operator_delete(local_a58[0],local_a48[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff2e8);
  if (local_9f8 != &local_9e8) {
    operator_delete(local_9f8,local_9e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffff300);
  if (local_9d8[0] != local_9c8) {
    operator_delete(local_9d8[0],local_9c8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ce8);
  if (local_9b8[0] != local_9a8) {
    operator_delete(local_9b8[0],local_9a8[0] + 1);
  }
  if (local_998[0] != local_988) {
    operator_delete(local_998[0],local_988[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_cc8);
  if (local_958 != &local_948) {
    operator_delete(local_958,local_948 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_978._M_dataplus._M_p != &local_978.field_2) {
    operator_delete(local_978._M_dataplus._M_p,local_978.field_2._M_allocated_capacity + 1);
  }
  if (local_938[0] != local_928) {
    operator_delete(local_938[0],local_928[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ca8);
  if (local_918[0] != local_908) {
    operator_delete(local_918[0],local_908[0] + 1);
  }
  if (local_8f8[0] != local_8e8) {
    operator_delete(local_8f8[0],local_8e8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c88);
  if (local_898 != &local_888) {
    operator_delete(local_898,local_888 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
    operator_delete(local_8b8._M_dataplus._M_p,local_8b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c70);
  if (local_878[0] != local_868) {
    operator_delete(local_878[0],local_868[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c58);
  if (local_858[0] != local_848) {
    operator_delete(local_858[0],local_848[0] + 1);
  }
  if (local_838[0] != local_828) {
    operator_delete(local_838[0],local_828[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c38);
  if (local_818[0] != local_808) {
    operator_delete(local_818[0],local_808[0] + 1);
  }
  if (local_7f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_7f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_7f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_7f8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c18);
  if (local_7d8[0] != local_7c8) {
    operator_delete(local_7d8[0],local_7c8[0] + 1);
  }
  if (local_7b8[0] != (pointer)local_7a8) {
    operator_delete(local_7b8[0],local_7a8._0_8_ + 1);
  }
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0],local_2c0[0] + 1);
  }
  if (local_2b0[0] != local_2a0) {
    operator_delete(local_2b0[0],local_2a0[0] + 1);
  }
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_b98);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getrawaddrman()
{
    return RPCHelpMan{"getrawaddrman",
        "EXPERIMENTAL warning: this call may be changed in future releases.\n"
        "\nReturns information on all address manager entries for the new and tried tables.\n",
        {},
        RPCResult{
            RPCResult::Type::OBJ_DYN, "", "", {
                {RPCResult::Type::OBJ_DYN, "table", "buckets with addresses in the address manager table ( new, tried )", {
                    {RPCResult::Type::OBJ, "bucket/position", "the location in the address manager table (<bucket>/<position>)", {
                        {RPCResult::Type::STR, "address", "The address of the node"},
                        {RPCResult::Type::NUM, "mapped_as", /*optional=*/true, "The ASN mapped to the IP of this peer per our current ASMap"},
                        {RPCResult::Type::NUM, "port", "The port number of the node"},
                        {RPCResult::Type::STR, "network", "The network (" + Join(GetNetworkNames(), ", ") + ") of the address"},
                        {RPCResult::Type::NUM, "services", "The services offered by the node"},
                        {RPCResult::Type::NUM_TIME, "time", "The " + UNIX_EPOCH_TIME + " when the node was last seen"},
                        {RPCResult::Type::STR, "source", "The address that relayed the address to us"},
                        {RPCResult::Type::STR, "source_network", "The network (" + Join(GetNetworkNames(), ", ") + ") of the source address"},
                        {RPCResult::Type::NUM, "source_mapped_as", /*optional=*/true, "The ASN mapped to the IP of this peer's source per our current ASMap"}
                    }}
                }}
            }
        },
        RPCExamples{
            HelpExampleCli("getrawaddrman", "")
            + HelpExampleRpc("getrawaddrman", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue {
            AddrMan& addrman = EnsureAnyAddrman(request.context);
            NodeContext& node_context = EnsureAnyNodeContext(request.context);
            CConnman& connman = EnsureConnman(node_context);

            UniValue ret(UniValue::VOBJ);
            ret.pushKV("new", AddrmanTableToJSON(addrman.GetEntries(false), connman));
            ret.pushKV("tried", AddrmanTableToJSON(addrman.GetEntries(true), connman));
            return ret;
        },
    };
}